

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xpath_derived_from(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,
                      lys_module *param_4,lyxp_set *set,int options)

{
  byte bVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  lys_node *plVar6;
  lyxp_set *plVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  ly_ctx *plVar12;
  
  plVar7 = *args;
  if ((options & 0x1cU) == 0) {
    if (plVar7->type < LYXP_SET_SNODE_SET) {
      iVar5 = lyxp_set_cast(args[1],LYXP_SET_STRING,cur_node,param_4,options);
      if (iVar5 == 0) {
        set_fill_boolean(set,0);
        plVar7 = *args;
        if (plVar7->type == LYXP_SET_EMPTY) {
          return 0;
        }
        uVar11 = 0;
        do {
          if (plVar7->used <= (uVar11 & 0xffff)) {
            return 0;
          }
          plVar2 = *(long **)((long)&((plVar7->val).nodes)->node + (ulong)((uVar11 & 0xffff) << 4));
          if (((*(byte *)(*plVar2 + 0x38) & 0xc) != 0) && (*(int *)(*plVar2 + 0x80) == 7)) {
            lVar3 = plVar2[8];
            bVar1 = *(byte *)(lVar3 + 0x1f);
            for (uVar10 = 0; bVar1 != uVar10; uVar10 = uVar10 + 1) {
              iVar5 = xpath_derived_from_ident_cmp
                                (*(lys_ident **)(*(long *)(lVar3 + 0x38) + uVar10 * 8),
                                 (args[1]->val).str);
              if (iVar5 == 0) {
                set_fill_boolean(set,1);
                if (uVar10 < *(byte *)(plVar2[8] + 0x1f)) {
                  return 0;
                }
                break;
              }
            }
            plVar7 = *args;
          }
          uVar11 = uVar11 + 1;
        } while( true );
      }
    }
    else {
      plVar12 = param_4->ctx;
      pcVar8 = print_set_type(plVar7);
      ly_vlog(plVar12,LYE_XPATH_INARGTYPE,LY_VLOG_NONE,(void *)0x0,1,pcVar8,
              "derived-from(node-set, string)");
    }
    return -1;
  }
  if ((plVar7->type == LYXP_SET_SNODE_SET) &&
     (plVar6 = warn_get_snode_in_ctx(plVar7), plVar6 != (lys_node *)0x0)) {
    if ((plVar6->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      plVar12 = param_4->ctx;
      pcVar8 = strnodetype(plVar6->nodetype);
      pcVar9 = "Argument #1 of %s is a %s node \"%s\".";
    }
    else {
      iVar4 = warn_is_specific_type((lys_type *)&plVar6[1].ref,LY_TYPE_IDENT);
      iVar5 = 0;
      if (iVar4 != 0) goto LAB_00179539;
      plVar12 = param_4->ctx;
      pcVar8 = plVar6->name;
      pcVar9 = "Argument #1 of %s is node \"%s\", not of type \"identityref\".";
    }
    iVar5 = 1;
    ly_log(plVar12,LY_LLWRN,LY_SUCCESS,pcVar9,"xpath_derived_from",pcVar8);
  }
  else {
    iVar5 = 1;
    ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s not a node-set as expected.",
           "xpath_derived_from");
  }
LAB_00179539:
  if ((args[1]->type == LYXP_SET_SNODE_SET) &&
     (plVar6 = warn_get_snode_in_ctx(args[1]), plVar6 != (lys_node *)0x0)) {
    if ((plVar6->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
      plVar12 = param_4->ctx;
      pcVar8 = strnodetype(plVar6->nodetype);
      pcVar9 = "Argument #2 of %s is a %s node \"%s\".";
    }
    else {
      iVar4 = warn_is_string_type((lys_type *)&plVar6[1].ref);
      if (iVar4 != 0) goto LAB_001795bc;
      plVar12 = param_4->ctx;
      pcVar8 = plVar6->name;
      pcVar9 = "Argument #2 of %s is node \"%s\", not of string-type.";
    }
    iVar5 = 1;
    ly_log(plVar12,LY_LLWRN,LY_SUCCESS,pcVar9,"xpath_derived_from",pcVar8);
  }
LAB_001795bc:
  set_snode_clear_ctx(set);
  return iVar5;
}

Assistant:

static int
xpath_derived_from(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
                   struct lyxp_set *set, int options)
{
    uint16_t i, j;
    struct lyd_node_leaf_list *leaf;
    struct lys_node_leaf *sleaf;
    int ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if ((args[0]->type != LYXP_SET_SNODE_SET) || !(sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s not a node-set as expected.", __func__);
            ret = EXIT_FAILURE;
        } else if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
            ret = EXIT_FAILURE;
        } else if (!warn_is_specific_type(&sleaf->type, LY_TYPE_IDENT)) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of type \"identityref\".", __func__, sleaf->name);
            ret = EXIT_FAILURE;
        }

        if ((args[1]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if ((args[0]->type != LYXP_SET_NODE_SET) && (args[0]->type != LYXP_SET_EMPTY)) {
        LOGVAL(local_mod->ctx, LYE_XPATH_INARGTYPE, LY_VLOG_NONE, NULL, 1, print_set_type(args[0]), "derived-from(node-set, string)");
        return -1;
    }
    if (lyxp_set_cast(args[1], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    set_fill_boolean(set, 0);
    if (args[0]->type != LYXP_SET_EMPTY) {
        for (i = 0; i < args[0]->used; ++i) {
            leaf = (struct lyd_node_leaf_list *)args[0]->val.nodes[i].node;
            sleaf = (struct lys_node_leaf *)leaf->schema;
            if ((sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST)) && (sleaf->type.base == LY_TYPE_IDENT)) {
                for (j = 0; j < leaf->value.ident->base_size; ++j) {
                    if (!xpath_derived_from_ident_cmp(leaf->value.ident->base[j], args[1]->val.str)) {
                        set_fill_boolean(set, 1);
                        break;
                    }
                }

                if (j < leaf->value.ident->base_size) {
                    break;
                }
            }
        }
    }

    return EXIT_SUCCESS;
}